

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

try_update_result_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::try_remove
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  atomic<long> *paVar1;
  long *plVar2;
  long lVar3;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  bVar4;
  optimistic_lock *poVar5;
  bool bVar6;
  optional<bool> oVar7;
  uint uVar8;
  int iVar9;
  pthread_t pVar10;
  ushort uVar11;
  basic_node_ptr<unodb::detail::olc_node_header> bVar12;
  ulong shifted_key_u64;
  _Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
  _Var13;
  ushort uVar14;
  version_type vVar15;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  *this_00;
  byte bVar16;
  read_critical_section rVar17;
  basic_node_ptr<unodb::detail::olc_node_header> local_c8;
  olc_node_ptr child;
  read_critical_section *local_b8;
  node_type *local_b0;
  basic_node_ptr<unodb::detail::olc_node_header> *local_a8;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_a0;
  undefined1 auStack_98 [8];
  leaf_reclaimable_ptr r;
  art_key_type k_local;
  write_guard local_70;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  write_guard node_guard;
  read_critical_section parent_critical_section;
  read_critical_section node_critical_section;
  uint local_38;
  node_type local_33;
  byte local_32;
  node_type local_31;
  node_type child_type;
  
  r._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)k.field_0;
  optimistic_lock::try_read_lock((optimistic_lock *)&node_guard);
  if (node_guard.lock != (optimistic_lock *)0x0) {
    bVar12.tagged_ptr = (this->root).value._M_i.tagged_ptr;
    bVar6 = optimistic_lock::check(node_guard.lock,(version_type)parent_critical_section.lock);
    if (bVar6) {
      if (bVar12.tagged_ptr == 0) {
        uVar14 = 0x100;
        uVar11 = 0;
        goto LAB_001b0805;
      }
      rVar17 = optimistic_lock::try_read_lock((optimistic_lock *)&parent_critical_section.version);
      vVar15 = parent_critical_section.version;
      if (parent_critical_section.version.version == 0) {
        uVar11 = 0;
        bVar16 = 0;
      }
      else {
        local_31 = (node_type)bVar12.tagged_ptr & (I256|I48);
        if ((bVar12.tagged_ptr & 7) == 0) {
          iVar9 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                            ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                             (bVar12.tagged_ptr & 0xfffffffffffffff8),
                             r._M_t.
                             super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                             ._M_head_impl,(void *)rVar17.version.version.version);
          if (iVar9 == 0) {
            bVar6 = optimistic_lock::try_upgrade_to_write_lock
                              (node_guard.lock,(version_type)parent_critical_section.lock);
            local_70.lock = (optimistic_lock *)0x0;
            if (bVar6) {
              local_70 = node_guard;
            }
            node_guard.lock = (optimistic_lock *)0x0;
            if (local_70.lock == (optimistic_lock *)0x0) {
              bVar16 = false;
            }
            else {
              bVar6 = optimistic_lock::try_upgrade_to_write_lock
                                ((optimistic_lock *)parent_critical_section.version.version,
                                 (version_type)node_critical_section.lock);
              vVar15.version =
                   (version_tag_type)
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)0x0;
              if (bVar6) {
                vVar15 = parent_critical_section.version;
              }
              parent_critical_section.version.version = 0;
              if ((in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   *)vVar15.version ==
                  (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   *)0x0) {
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
              }
              else {
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)vVar15.version;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          ((atomic_version_type *)vVar15.version);
                pVar10 = pthread_self();
                ((__atomic_base<unsigned_long> *)
                &(((in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)(vVar15.version + 0x10))->value)._M_i)->_M_i = pVar10;
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                (this->root).value._M_i.tagged_ptr = 0;
                auStack_98 = (undefined1  [8])this;
                r._M_t.
                super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                ._M_head_impl.db_instance =
                     (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                      )(_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                        )(bVar12.tagged_ptr & 0xfffffffffffffff8);
                std::
                unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)auStack_98);
              }
              bVar16 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)vVar15.version !=
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
              optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
            }
            optimistic_lock::write_guard::~write_guard(&local_70);
            uVar11 = 1;
          }
          else {
            if (*(long *)(vVar15.version + 8) < 1) {
LAB_001b08ef:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar5 = *(optimistic_lock **)vVar15.version;
            if (node_critical_section.lock == poVar5) {
LAB_001b072a:
              LOCK();
              plVar2 = (long *)(vVar15.version + 8);
              lVar3 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (SBORROW8(lVar3,1) != *plVar2 < 0) {
LAB_001b08d0:
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
            }
            else {
              LOCK();
              plVar2 = (long *)(vVar15.version + 8);
              lVar3 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (SBORROW8(lVar3,1) != *plVar2 < 0) goto LAB_001b08d0;
              if (node_critical_section.lock == poVar5) goto LAB_001b072a;
            }
            bVar16 = node_critical_section.lock == poVar5;
            parent_critical_section.version.version = 0;
            uVar11 = 0;
          }
        }
        else {
          local_70.lock = (optimistic_lock *)&this->root;
          k_local.field_0 =
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               ((ulong)r._M_t.
                       super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       .
                       super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                       ._M_head_impl >> 8);
          local_38 = (uint)((ulong)r._M_t.
                                   super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   .
                                   super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                                   ._M_head_impl >> 8);
          _Var13 = r._M_t.
                   super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   .
                   super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
          ;
          local_a0 = this;
          node_critical_section.version.version = (version_tag_type)k_local.field_0;
          do {
            if (local_31 == LEAF) {
              __assert_fail("node_type != node_type::LEAF",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x7d6,
                            "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                       *)(bVar12.tagged_ptr & 0xfffffffffffffff8);
            bVar4 = this_00[0x1f];
            if (7 < (byte)bVar4) {
              __assert_fail("result <= key_prefix_capacity",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                            ,0x298,
                            "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                           );
            }
            shifted_key_u64 = (ulong)_Var13._M_head_impl & 0xff | (long)k_local.field_0 << 8;
            uVar8 = detail::
                    key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                    ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                         *)(this_00 + 0x18),shifted_key_u64);
            if (uVar8 < (byte)bVar4) {
              if (((node_guard.lock)->read_lock_count).super___atomic_base<long>._M_i < 1)
              goto LAB_001b08ef;
              poVar5 = (optimistic_lock *)
                       ((node_guard.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
              if (parent_critical_section.lock == poVar5) {
LAB_001b04e7:
                LOCK();
                paVar1 = &(node_guard.lock)->read_lock_count;
                lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_001b08d0;
                node_guard.lock = (optimistic_lock *)0x0;
                if (parent_critical_section.lock != poVar5) goto LAB_001b06bd;
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_001b08ef;
                poVar5 = *(optimistic_lock **)parent_critical_section.version.version;
                if (node_critical_section.lock == poVar5) {
LAB_001b0524:
                  LOCK();
                  plVar2 = (long *)(parent_critical_section.version.version + 8);
                  lVar3 = *plVar2;
                  *plVar2 = *plVar2 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != *plVar2 < 0) goto LAB_001b08d0;
                }
                else {
                  LOCK();
                  plVar2 = (long *)(parent_critical_section.version.version + 8);
                  lVar3 = *plVar2;
                  *plVar2 = *plVar2 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != *plVar2 < 0) goto LAB_001b08d0;
                  if (node_critical_section.lock == poVar5) goto LAB_001b0524;
                }
                node_critical_section.version.version =
                     (version_tag_type)(node_critical_section.lock == poVar5);
                parent_critical_section.version.version = 0;
                local_38 = local_38 & 0xff;
                if (node_critical_section.lock == poVar5) {
                  local_38 = 0;
                }
              }
              else {
                LOCK();
                paVar1 = &(node_guard.lock)->read_lock_count;
                lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_001b08d0;
                if (parent_critical_section.lock == poVar5) goto LAB_001b04e7;
LAB_001b06bd:
                node_critical_section.version.version = 0;
              }
              node_guard.lock = (optimistic_lock *)0x0;
              bVar6 = false;
            }
            else {
              if (uVar8 != (byte)bVar4) {
                __assert_fail("shared_prefix_length == key_prefix_length",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                              ,0x7e7,
                              "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<unsigned long, std::span<const std::byte>>::try_remove(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                             );
              }
              _Var13._M_head_impl =
                   (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                   (shifted_key_u64 >> (((byte)bVar4 & 7) << 3));
              auStack_98 = (undefined1  [8])0x0;
              r._M_t.
              super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              .
              super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              .
              super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
              ._M_head_impl.db_instance =
                   (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                    )(db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      )0x0;
              local_32 = (byte)_Var13._M_head_impl;
              child.tagged_ptr = (uintptr_t)&node_in_parent;
              local_b8 = (read_critical_section *)auStack_98;
              local_b0 = &local_33;
              local_a8 = &local_c8;
              oVar7 = detail::
                      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                      ::
                      remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
                                (this_00,local_31,&local_32,
                                 (basic_art_key<unsigned_long> *)
                                 &r._M_t.
                                  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                  .
                                  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
                                 ,local_a0,(read_critical_section *)&node_guard,
                                 (read_critical_section *)&parent_critical_section.version,
                                 (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                  **)&local_70,
                                 (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                                  ***)&child,&local_b8,&local_b0,&local_a8);
              k_local.field_0 =
                   (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                   ((ulong)_Var13._M_head_impl >> 8);
              if (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                           super__Optional_payload_base<bool> >> 8 & 1) == 0) {
                node_critical_section.version.version = 0;
LAB_001b0674:
                bVar6 = false;
              }
              else {
                if (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                             super__Optional_payload_base<bool> & 1) == 0) {
                  node_critical_section.version.version = 1;
                  local_38 = 0;
                  goto LAB_001b0674;
                }
                if (node_in_parent ==
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)0x0) {
                  local_38 = 1;
                  bVar6 = false;
                  node_critical_section.version.version = 1;
                }
                else {
                  node_guard.lock = (optimistic_lock *)parent_critical_section.version.version;
                  parent_critical_section.lock = node_critical_section.lock;
                  local_70.lock = (optimistic_lock *)node_in_parent;
                  parent_critical_section.version.version = (version_tag_type)auStack_98;
                  node_critical_section.lock =
                       (optimistic_lock *)
                       r._M_t.
                       super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       .
                       super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       .
                       super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                       ._M_head_impl.db_instance;
                  auStack_98 = (undefined1  [8])0x0;
                  local_31 = local_33;
                  k_local.field_0 =
                       (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                       ((ulong)_Var13._M_head_impl >> 0x10);
                  bVar6 = true;
                  bVar12.tagged_ptr = local_c8.tagged_ptr;
                  _Var13._M_head_impl =
                       (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                       ((ulong)_Var13._M_head_impl >> 8 & 0xffffff);
                }
              }
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)auStack_98);
            }
          } while (bVar6);
          uVar11 = (ushort)local_38 & 0xff;
          bVar16 = (byte)node_critical_section.version.version;
        }
      }
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&parent_critical_section.version);
      uVar14 = (ushort)bVar16 << 8;
      goto LAB_001b0805;
    }
    node_guard.lock = (optimistic_lock *)0x0;
  }
  uVar11 = 0;
  uVar14 = 0;
LAB_001b0805:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&node_guard);
  return (_Optional_base<bool,_true,_true>)(uVar11 | uVar14);
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_remove(art_key_type k) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) return false;

  auto node_critical_section = node_ptr_lock(node).try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node_type = node.type();

  if (node_type == node_type::LEAF) {
    auto* const leaf{node.template ptr<leaf_type*>()};
    if (leaf->matches(k)) {
      const optimistic_lock::write_guard parent_guard{
          std::move(parent_critical_section)};
      // Do not call spin_wait_loop_body from this point on - assume
      // the above took enough time
      if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

      optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
      if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

      node_guard.unlock_and_obsolete();

      const auto r{art_policy::reclaim_leaf_on_scope_exit(leaf, *this)};
      root = detail::olc_node_ptr{nullptr};
      return true;
    }

    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return {};  // LCOV_EXCL_LINE

      return false;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    UNODB_DETAIL_DISABLE_MSVC_WARNING(26494)
    in_critical_section<detail::olc_node_ptr>* child_in_parent;
    enum node_type child_type;
    detail::olc_node_ptr child;
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

    optimistic_lock::read_critical_section child_critical_section;

    const auto opt_remove_result{
        inode->template remove_or_choose_subtree<std::optional<bool>>(
            node_type, remaining_key[0], k, *this, parent_critical_section,
            node_critical_section, node_in_parent, &child_in_parent,
            &child_critical_section, &child_type, &child)};

    if (UNODB_DETAIL_UNLIKELY(!opt_remove_result)) return {};

    if (const auto remove_result{*opt_remove_result}; !remove_result)
      return false;

    if (child_in_parent == nullptr) return true;

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    node_critical_section = std::move(child_critical_section);
    node_type = child_type;

    ++depth;
    remaining_key.shift_right(1);
  }
}